

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O3

uint __thiscall nv::ColorBlock::countUniqueColors(ColorBlock *this)

{
  uint uVar1;
  int i;
  long lVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  
  lVar2 = 0;
  uVar1 = 0;
  do {
    if (lVar2 == 0) {
      uVar4 = 1;
    }
    else {
      bVar3 = 1;
      lVar5 = 0;
      do {
        if (this->m_color[lVar2].field_0.u != this->m_color[lVar5].field_0.u) {
          bVar3 = 0;
        }
        lVar5 = lVar5 + 1;
      } while (lVar2 != lVar5);
      uVar4 = (uint)bVar3;
    }
    uVar1 = uVar1 + uVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return uVar1;
}

Assistant:

uint ColorBlock::countUniqueColors() const
{
	uint count = 0;

	// @@ This does not have to be o(n^2)
	for(int i = 0; i < 16; i++)
	{
		bool unique = true;
		for(int j = 0; j < i; j++) {
			if( m_color[i] != m_color[j] ) {
				unique = false;
			}
		}
		
		if( unique ) {
			count++;
		}
	}
	
	return count;
}